

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gkc.c
# Opt level: O0

uint64_t band(gkc_summary *s,uint64_t delta)

{
  size_t sVar1;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint64_t diff;
  uint64_t delta_local;
  gkc_summary *s_local;
  
  sVar1 = s->nr_elems;
  auVar6._8_4_ = (int)(sVar1 >> 0x20);
  auVar6._0_8_ = sVar1;
  auVar6._12_4_ = 0x45300000;
  dVar5 = s->epsilon *
          ((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
  auVar7._8_4_ = (int)(delta >> 0x20);
  auVar7._0_8_ = delta;
  auVar7._12_4_ = 0x45300000;
  dVar5 = (dVar5 + dVar5 + 1.0) -
          ((auVar7._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)delta) - 4503599627370496.0));
  uVar2 = (ulong)dVar5;
  uVar2 = uVar2 | (long)(dVar5 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
  if (uVar2 == 1) {
    s_local = (gkc_summary *)0x0;
  }
  else {
    uVar3 = ullog2(uVar2);
    uVar4 = ullog2(2);
    s_local = (gkc_summary *)(uVar3 / uVar4);
  }
  return (uint64_t)s_local;
}

Assistant:

static uint64_t band(struct gkc_summary *s, uint64_t delta)
{
    uint64_t diff;

    diff = 1 + (s->epsilon * s->nr_elems * 2) - delta;

    if (diff == 1) {
        return 0;
    } else {
        return ullog2(diff)/ullog2(2);
    }
}